

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

void __thiscall cmCTest::AddSiteProperties(cmCTest *this,cmXMLWriter *xml)

{
  cmState *pcVar1;
  cmCTestGenericHandler *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *__end;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Base_ptr p_Var6;
  pointer content;
  string l;
  char *label;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char *subproject;
  string local_98;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  _Base_ptr local_40;
  char *local_38;
  
  pcVar2 = GetHandler(this,"script");
  p_Var6 = pcVar2[4].Options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var6 != (_Base_ptr)0x0) {
    pcVar1 = (cmState *)p_Var6[0x14]._M_left;
    paVar5 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"SubProject","");
    local_38 = cmState::GetGlobalProperty(pcVar1,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar5) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (local_38 != (char *)0x0) {
      local_98._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Subproject","");
      cmXMLWriter::StartElement(xml,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar5) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      cmXMLWriter::Attribute<char_const*>(xml,"name",&local_38);
      pcVar1 = (cmState *)
               pcVar2[4].Options._M_t._M_impl.super__Rb_tree_header._M_header._M_left[0x14]._M_left;
      local_98._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"SubProjectLabels","");
      pcVar3 = cmState::GetGlobalProperty(pcVar1,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar5) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (pcVar3 != (char *)0x0) {
        local_98._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Labels","");
        cmXMLWriter::StartElement(xml,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar5) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        local_98._M_dataplus._M_p = (pointer)paVar5;
        sVar4 = strlen(pcVar3);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar3,pcVar3 + sVar4);
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_40 = p_Var6;
        cmSystemTools::ExpandListArgument(&local_98,&local_58,false);
        if (local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          content = local_58.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Label","");
            cmXMLWriter::StartElement(xml,&local_78);
            cmXMLWriter::Content<std::__cxx11::string>(xml,content);
            cmXMLWriter::EndElement(xml);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            content = content + 1;
          } while (content !=
                   local_58.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        cmXMLWriter::EndElement(xml);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_58);
        p_Var6 = local_40;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      cmXMLWriter::EndElement(xml);
    }
    paVar5 = &local_98.field_2;
    pcVar1 = (cmState *)p_Var6[0x14]._M_left;
    local_98._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Label","");
    pcVar3 = cmState::GetGlobalProperty(pcVar1,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar5) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (pcVar3 != (char *)0x0) {
      local_98._M_dataplus._M_p = (pointer)paVar5;
      local_78._M_dataplus._M_p = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Labels","");
      cmXMLWriter::StartElement(xml,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar5) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      local_98._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Label","");
      cmXMLWriter::StartElement(xml,&local_98);
      cmXMLWriter::Content<char_const*>(xml,(char **)&local_78);
      cmXMLWriter::EndElement(xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar5) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      cmXMLWriter::EndElement(xml);
    }
  }
  return;
}

Assistant:

void cmCTest::AddSiteProperties(cmXMLWriter& xml)
{
  cmCTestScriptHandler* ch =
    static_cast<cmCTestScriptHandler*>(this->GetHandler("script"));
  cmake* cm =  ch->GetCMake();
  // if no CMake then this is the old style script and props like
  // this will not work anyway.
  if(!cm)
    {
    return;
    }
  // This code should go when cdash is changed to use labels only
  const char* subproject = cm->GetState()
                             ->GetGlobalProperty("SubProject");
  if(subproject)
    {
    xml.StartElement("Subproject");
    xml.Attribute("name", subproject);
    const char* labels =
      ch->GetCMake()->GetState()
                    ->GetGlobalProperty("SubProjectLabels");
    if(labels)
      {
      xml.StartElement("Labels");
      std::string l = labels;
      std::vector<std::string> args;
      cmSystemTools::ExpandListArgument(l, args);
      for(std::vector<std::string>::iterator i = args.begin();
          i != args.end(); ++i)
        {
        xml.Element("Label", *i);
        }
      xml.EndElement();
      }
    xml.EndElement();
    }

  // This code should stay when cdash only does label based sub-projects
  const char* label = cm->GetState()->GetGlobalProperty("Label");
  if(label)
    {
    xml.StartElement("Labels");
    xml.Element("Label", label);
    xml.EndElement();
    }
}